

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxClone.cpp
# Opt level: O0

int slang::syntax::deep::clone(__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  SeparatedSyntaxList<slang::syntax::DeclaratorSyntax> *args_2;
  ParameterDeclarationSyntax *pPVar1;
  Token TVar2;
  BumpAllocator *in_stack_00000118;
  SeparatedSyntaxList<slang::syntax::DeclaratorSyntax> *in_stack_00000120;
  BumpAllocator *in_stack_ffffffffffffffc8;
  BumpAllocator *this;
  
  this = (BumpAllocator *)__child_stack;
  TVar2 = parsing::Token::deepClone((Token *)in_stack_00000120,in_stack_00000118);
  not_null<slang::syntax::DataTypeSyntax_*>::operator*
            ((not_null<slang::syntax::DataTypeSyntax_*> *)0x94bec3);
  args_2 = (SeparatedSyntaxList<slang::syntax::DeclaratorSyntax> *)
           deepClone<slang::syntax::DataTypeSyntax>
                     ((DataTypeSyntax *)__child_stack,in_stack_ffffffffffffffc8);
  deepClone<slang::syntax::DeclaratorSyntax>(in_stack_00000120,in_stack_00000118);
  pPVar1 = BumpAllocator::
           emplace<slang::syntax::ParameterDeclarationSyntax,slang::parsing::Token,slang::syntax::DataTypeSyntax&,slang::syntax::SeparatedSyntaxList<slang::syntax::DeclaratorSyntax>&>
                     (this,(Token *)TVar2.info,TVar2._0_8_,args_2);
  return (int)pPVar1;
}

Assistant:

static SyntaxNode* clone(const ParameterDeclarationSyntax& node, BumpAllocator& alloc) {
    return alloc.emplace<ParameterDeclarationSyntax>(
        node.keyword.deepClone(alloc),
        *deepClone<DataTypeSyntax>(*node.type, alloc),
        *deepClone(node.declarators, alloc)
    );
}